

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void filemgr_clear_mergetree(filemgr *file)

{
  avl_node *node;
  avl_node *paVar1;
  
  node = avl_first(&file->mergetree);
  while (node != (avl_node *)0x0) {
    paVar1 = avl_next(node);
    avl_remove(&file->mergetree,node);
    free(&node[-1].left);
    node = paVar1;
  }
  return;
}

Assistant:

void filemgr_clear_mergetree(struct filemgr *file)
{
    struct avl_node *a;
    struct stale_data *entry;

    a = avl_first(&file->mergetree);
    while (a) {
        entry = _get_entry(a, struct stale_data, avl);
        a = avl_next(&entry->avl);
        avl_remove(&file->mergetree, &entry->avl);
        free(entry);
    }
}